

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedentity.cpp
# Opt level: O3

bool __thiscall libcellml::NamedEntity::doEquals(NamedEntity *this,EntityPtr *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EntityImpl *pEVar2;
  long lVar3;
  size_t __n;
  long *plVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  bVar5 = Entity::doEquals((Entity *)this,other);
  if ((bVar5) &&
     (peVar1 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar1 != (element_type *)0x0)) {
    bVar5 = false;
    lVar7 = __dynamic_cast(peVar1,&Entity::typeinfo,&typeinfo,0);
    if (lVar7 != 0) {
      this_00 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pEVar2 = (this->super_ParentedEntity).super_Entity.mPimpl;
      lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,lVar3,*(long *)(*(long *)(lVar7 + 8) + 0x38) + lVar3);
      plVar4 = local_40;
      __n = *(size_t *)((long)&pEVar2[1].mId.field_2 + 8);
      if (__n == local_38) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar6 = bcmp((void *)pEVar2[1].mId.field_2._M_allocated_capacity,local_40,__n);
          bVar5 = iVar6 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (plVar4 != local_30) {
        operator_delete(plVar4,local_30[0] + 1);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool NamedEntity::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto namedEntity = std::dynamic_pointer_cast<NamedEntity>(other);
        if (namedEntity != nullptr) {
            return pFunc()->mName == namedEntity->name();
        }
    }
    return false;
}